

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O1

string * __thiscall
license::get_file_contents_abi_cxx11_
          (string *__return_storage_ptr__,license *this,char *filename,size_t max_size)

{
  char *pcVar1;
  runtime_error *this_00;
  int *piVar2;
  ifstream in;
  long local_228 [4];
  byte abStack_208 [488];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_228,(char *)this,_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    std::istream::seekg((long)local_228,_S_beg);
    pcVar1 = (char *)std::istream::tellg();
    if (pcVar1 < filename) {
      filename = pcVar1;
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)filename);
    std::istream::seekg((long)local_228,_S_beg);
    std::istream::read((char *)local_228,(long)(__return_storage_ptr__->_M_dataplus)._M_p);
    std::ifstream::close();
    std::ifstream::~ifstream(local_228);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar2 = __errno_location();
  pcVar1 = strerror(*piVar2);
  std::runtime_error::runtime_error(this_00,pcVar1);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string get_file_contents(const char *filename, size_t max_size) {
	string contents;
	ifstream in(filename, std::ios::binary);
	if (in) {
		size_t index = (size_t)in.seekg(0, ios::end).tellg();
		size_t limited_size = min(index, max_size);
		contents.resize(limited_size);
		in.seekg(0, ios::beg);
		in.read(&contents[0], limited_size);
		in.close();
	} else {
		throw runtime_error(std::strerror(errno));
	}
	return contents;
}